

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O2

void __thiscall DFATest_ChainUnzip_Test::DFATest_ChainUnzip_Test(DFATest_ChainUnzip_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001d67e0;
  return;
}

Assistant:

TEST(DFATest, ChainUnzip) {
  // Chain A->B->C->D looks a lot like chain W->X->Y->Z, but since Z is
  // distinguishable, the full chains end up being separated.
  State a{"A", {"B"}}, w{"W", {"X"}};
  State b{"B", {"C"}}, x{"X", {"Y"}};
  State c{"C", {"D"}}, y{"Y", {"Z"}};
  State d{"D", {}}, z{"Z", {}};
  Graph graph = {{a, b, c, d, w, x, y}, {z}};
  auto results = DFA::refinePartitions(graph);
  validate(graph, results);
  EXPECT_EQ(
    settify(results),
    (SetResults{{"A"}, {"W"}, {"B"}, {"X"}, {"C"}, {"Y"}, {"D"}, {"Z"}}));
}